

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

int Ivy_FastMapMerge(Ivy_Supp_t *pSupp0,Ivy_Supp_t *pSupp1,Ivy_Supp_t *pSupp,int nLimit)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  
  bVar2 = pSupp0->nSize;
  cVar3 = pSupp1->nSize;
  uVar9 = (uint)cVar3;
  if ((char)bVar2 < cVar3) {
    __assert_fail("pSupp0->nSize >= pSupp1->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                  ,0x2c6,"int Ivy_FastMapMerge(Ivy_Supp_t *, Ivy_Supp_t *, Ivy_Supp_t *, int)");
  }
  iVar10 = (int)(char)bVar2;
  uVar6 = (ulong)bVar2;
  if (uVar9 == nLimit && iVar10 == nLimit) {
    uVar8 = 0;
    uVar7 = (ulong)(uint)nLimit;
    if (nLimit < 1) {
      uVar7 = uVar8;
    }
    do {
      if (uVar7 == uVar8) {
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          *(undefined4 *)(&pSupp[1].nSize + uVar8 * 4) =
               *(undefined4 *)(&pSupp0[1].nSize + uVar8 * 4);
        }
        goto LAB_00625b3f;
      }
      lVar14 = uVar8 * 4;
      lVar1 = uVar8 * 4;
      uVar8 = uVar8 + 1;
    } while (*(int *)(&pSupp0[1].nSize + lVar14) == *(int *)(&pSupp1[1].nSize + lVar1));
LAB_00625b1e:
    iVar10 = 0;
  }
  else {
    if (iVar10 == nLimit) {
      uVar8 = 0;
      uVar7 = (ulong)uVar9;
      if (cVar3 < '\x01') {
        uVar7 = uVar8;
      }
      for (; uVar13 = (ulong)(uint)nLimit, uVar8 != uVar7; uVar8 = uVar8 + 1) {
        do {
          if ((int)uVar13 < 1) {
            if (uVar13 == 0) goto LAB_00625b1e;
            break;
          }
          lVar14 = uVar13 * 2;
          uVar13 = uVar13 - 1;
        } while (*(int *)(&pSupp0->Delay + lVar14) != *(int *)(&pSupp1[1].nSize + uVar8 * 4));
      }
      uVar8 = 0;
      uVar7 = (ulong)(uint)nLimit;
      if (nLimit < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)(&pSupp[1].nSize + uVar8 * 4) = *(undefined4 *)(&pSupp0[1].nSize + uVar8 * 4)
        ;
      }
    }
    else {
      uVar6 = 0;
      uVar7 = (ulong)(uint)nLimit;
      if (nLimit < 1) {
        uVar7 = uVar6;
      }
      iVar11 = 0;
      uVar12 = 0;
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        if (uVar12 == uVar9) {
          if (iVar11 == iVar10) goto LAB_00625b3f;
          *(undefined4 *)(&pSupp[1].nSize + uVar6 * 4) =
               *(undefined4 *)(&pSupp0[1].nSize + (long)iVar11 * 4);
          iVar11 = iVar11 + 1;
          uVar12 = uVar9;
        }
        else {
          lVar14 = (long)(int)uVar12;
          if (iVar11 == iVar10) {
            uVar12 = uVar12 + 1;
            *(undefined4 *)(&pSupp[1].nSize + uVar6 * 4) =
                 *(undefined4 *)(&pSupp1[1].nSize + lVar14 * 4);
            iVar11 = iVar10;
          }
          else {
            iVar4 = *(int *)(&pSupp0[1].nSize + (long)iVar11 * 4);
            iVar5 = *(int *)(&pSupp1[1].nSize + lVar14 * 4);
            if (iVar4 < iVar5) {
              iVar11 = iVar11 + 1;
              *(int *)(&pSupp[1].nSize + uVar6 * 4) = iVar4;
            }
            else if (iVar5 < iVar4) {
              uVar12 = uVar12 + 1;
              *(int *)(&pSupp[1].nSize + uVar6 * 4) = iVar5;
            }
            else {
              iVar11 = iVar11 + 1;
              *(int *)(&pSupp[1].nSize + uVar6 * 4) = iVar4;
              uVar12 = uVar12 + 1;
            }
          }
        }
      }
      uVar6 = uVar7;
      if ((int)uVar12 < (int)uVar9 || iVar11 < iVar10) goto LAB_00625b1e;
    }
LAB_00625b3f:
    pSupp->nSize = (char)uVar6;
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

int Ivy_FastMapMerge( Ivy_Supp_t * pSupp0, Ivy_Supp_t * pSupp1, Ivy_Supp_t * pSupp, int nLimit )
{ 
    int i, k, c;
    assert( pSupp0->nSize >= pSupp1->nSize );
    // the case of the largest cut sizes
    if ( pSupp0->nSize == nLimit && pSupp1->nSize == nLimit )
    {
        for ( i = 0; i < pSupp0->nSize; i++ )
            if ( pSupp0->pArray[i] != pSupp1->pArray[i] )
                return 0;
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pSupp0->nSize == nLimit )
    {
        for ( i = 0; i < pSupp1->nSize; i++ )
        {
            for ( k = pSupp0->nSize - 1; k >= 0; k-- )
                if ( pSupp0->pArray[k] == pSupp1->pArray[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < nLimit; c++ )
    {
        if ( k == pSupp1->nSize )
        {
            if ( i == pSupp0->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( i == pSupp0->nSize )
        {
            if ( k == pSupp1->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        if ( pSupp0->pArray[i] < pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( pSupp0->pArray[i] > pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        pSupp->pArray[c] = pSupp0->pArray[i++]; 
        k++;
    }
    if ( i < pSupp0->nSize || k < pSupp1->nSize )
        return 0;
    pSupp->nSize = c;
    return 1;
}